

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,
          formatDefinition *texture_format,resolutionDefinition *resolution,bool mutability)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  uint n_mipmap_levels;
  undefined7 in_register_00000081;
  GLint mipmap_level_1;
  GLint mipmap_level;
  uint uVar5;
  GLint face;
  GLint cube_face;
  uint uVar6;
  GLuint GVar7;
  uint uVar8;
  GLuint GVar9;
  uint uVar10;
  undefined8 local_48;
  Functions *gl;
  
  uVar5 = 0;
  __len = 6;
  uVar2 = resolution->m_depth / 6;
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  n_mipmap_levels = (uint)bVar1;
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  textureDefinition::bind(texture,0x9009,__addr,__len);
  if ((int)CONCAT71(in_register_00000081,mutability) == 0) {
    (*gl->texStorage3D)(0x9009,(uint)bVar1,(texture_format->m_source).m_internal_format,
                        resolution->m_width,resolution->m_height,resolution->m_depth);
  }
  else {
    GVar7 = resolution->m_width;
    GVar9 = resolution->m_height;
    for (; n_mipmap_levels != uVar5; uVar5 = uVar5 + 1) {
      (*gl->texImage3D)(0x9009,uVar5,(texture_format->m_source).m_internal_format,GVar7,GVar9,
                        resolution->m_depth,0,(texture_format->m_source).m_format,
                        (texture_format->m_source).m_type,(void *)0x0);
      uVar6 = -(uint)(1 < (int)GVar7 / 2);
      uVar8 = -(uint)(1 < (int)GVar9 / 2);
      GVar7 = ~uVar6 & 1 | (int)GVar7 / 2 & uVar6;
      GVar9 = ~uVar8 & 1 | (int)GVar9 / 2 & uVar8;
    }
  }
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to allocate storage for texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0xda0);
  local_48._0_4_ = resolution->m_width;
  local_48._4_4_ = resolution->m_height;
  for (uVar5 = 0; uVar5 != n_mipmap_levels; uVar5 = uVar5 + 1) {
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      for (cube_face = 0; cube_face != 6; cube_face = cube_face + 1) {
        prepareTextureFace(gl,cube_face,uVar6,uVar5,uVar2,n_mipmap_levels,
                           (texture_format->m_source).m_format,(texture_format->m_source).m_type,
                           (int)local_48,local_48._4_4_);
      }
    }
    uVar6 = (int)local_48 / 2;
    uVar8 = -(uint)(1 < (int)uVar6);
    uVar10 = -(uint)(1 < local_48._4_4_ / 2);
    local_48 = CONCAT44(~uVar10 & 1 | local_48._4_4_ / 2 & uVar10,~uVar8 & 1 | uVar6 & uVar8);
  }
  GVar4 = (texture_format->m_source).m_internal_format;
  uVar2 = GVar4 - 0x8d48;
  if (((0x3a < uVar2) || ((0x400010000000001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
     (GVar4 != 0x8cac)) {
    return;
  }
  (*gl->texParameteri)(0x9009,0x2800,0x2600);
  (*gl->texParameteri)(0x9009,0x2801,0x2700);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareTexture(const textureDefinition&	texture,
													 const formatDefinition&	 texture_format,
													 const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint n_elements		 = resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, texture_format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, texture_format.m_source.m_internal_format,
						  texture_width, texture_height, resolution.m_depth, 0 /* border */,
						  texture_format.m_source.m_format, texture_format.m_source.m_type, 0 /* data */);

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to allocate storage for texture");

	texture_width  = resolution.m_width;
	texture_height = resolution.m_height;

	for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
	{
		for (glw::GLint element_index = 0; element_index < n_elements; ++element_index)
		{
			for (glw::GLint face = 0; face < n_faces; ++face)
			{
				prepareTextureFace(gl, face, element_index, mipmap_level, n_elements, n_mipmap_levels,
								   texture_format.m_source.m_format, texture_format.m_source.m_type, texture_width,
								   texture_height);
			}
		}

		texture_width  = de::max(1, texture_width / 2);
		texture_height = de::max(1, texture_height / 2);
	}

	// not texture filterable formats
	if ((texture_format.m_source.m_internal_format == GL_RGBA32UI) ||
		(texture_format.m_source.m_internal_format == GL_RGBA32I) ||
		(texture_format.m_source.m_internal_format == GL_STENCIL_INDEX8) ||
		(texture_format.m_source.m_internal_format == GL_DEPTH_COMPONENT32F))
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	}
}